

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer.h
# Opt level: O3

bool __thiscall Slicer::buildDG(Slicer *this,bool compute_deps)

{
  LLVMDependenceGraph *pLVar1;
  unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *puVar2;
  raw_ostream *this_00;
  LLVMDependenceGraph *pLVar3;
  StringRef Str;
  
  puVar2 = dg::llvmdg::LLVMDependenceGraphBuilder::constructCFGOnly(&this->_builder);
  pLVar3 = (puVar2->_M_t).
           super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
           .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl;
  (puVar2->_M_t).
  super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>._M_t
  .super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>.
  super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl = (LLVMDependenceGraph *)0x0;
  pLVar1 = (this->_dg)._M_t.
           super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
           .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl;
  (this->_dg)._M_t.
  super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>._M_t
  .super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>.
  super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl = pLVar3;
  if (pLVar1 != (LLVMDependenceGraph *)0x0) {
    (**(code **)(*(long *)pLVar1 + 8))();
    pLVar3 = (this->_dg)._M_t.
             super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
             ._M_t.
             super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
             .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl;
  }
  if (pLVar3 == (LLVMDependenceGraph *)0x0) {
    this_00 = (raw_ostream *)llvm::errs();
    Str.Length = 0x26;
    Str.Data = "Building the dependence graph failed!\n";
    llvm::raw_ostream::operator<<(this_00,Str);
  }
  else if (compute_deps) {
    computeDependencies(this);
  }
  return pLVar3 != (LLVMDependenceGraph *)0x0;
}

Assistant:

bool buildDG(bool compute_deps = false) {
        _dg = std::move(_builder.constructCFGOnly());

        if (!_dg) {
            llvm::errs() << "Building the dependence graph failed!\n";
            return false;
        }

        if (compute_deps)
            computeDependencies();

        return true;
    }